

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileByName(DescriptorPool *this,ConstStringParam name)

{
  bool bVar1;
  pointer pTVar2;
  StringPiece local_70;
  StringPiece local_60;
  undefined4 local_50;
  StringPiece local_40;
  DescriptorPool *local_30;
  FileDescriptor *result;
  MutexLockMaybe lock;
  ConstStringParam name_local;
  DescriptorPool *this_local;
  
  lock.mu_ = (Mutex *)name;
  internal::MutexLockMaybe::MutexLockMaybe((MutexLockMaybe *)&result,this->mutex_);
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    pTVar2 = std::
             unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ::operator->(&this->tables_);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&pTVar2->known_bad_symbols_);
    pTVar2 = std::
             unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ::operator->(&this->tables_);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&pTVar2->known_bad_files_);
  }
  pTVar2 = std::
           unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           ::operator->(&this->tables_);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock.mu_
            );
  local_30 = (DescriptorPool *)Tables::FindFile(pTVar2,local_40);
  this_local = local_30;
  if ((local_30 == (DescriptorPool *)0x0) &&
     ((this->underlay_ == (DescriptorPool *)0x0 ||
      (local_30 = (DescriptorPool *)FindFileByName(this->underlay_,(ConstStringParam)lock.mu_),
      this_local = local_30, local_30 == (DescriptorPool *)0x0)))) {
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
              (&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock.mu_);
    bVar1 = TryFindFileInFallbackDatabase(this,local_60);
    if (bVar1) {
      pTVar2 = std::
               unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ::operator->(&this->tables_);
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                (&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock.mu_);
      local_30 = (DescriptorPool *)Tables::FindFile(pTVar2,local_70);
      this_local = local_30;
      if (local_30 != (DescriptorPool *)0x0) goto LAB_0064990d;
    }
    this_local = (DescriptorPool *)0x0;
  }
LAB_0064990d:
  local_50 = 1;
  internal::MutexLockMaybe::~MutexLockMaybe((MutexLockMaybe *)&result);
  return (FileDescriptor *)this_local;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileByName(
    ConstStringParam name) const {
  MutexLockMaybe lock(mutex_);
  if (fallback_database_ != nullptr) {
    tables_->known_bad_symbols_.clear();
    tables_->known_bad_files_.clear();
  }
  const FileDescriptor* result = tables_->FindFile(name);
  if (result != nullptr) return result;
  if (underlay_ != nullptr) {
    result = underlay_->FindFileByName(name);
    if (result != nullptr) return result;
  }
  if (TryFindFileInFallbackDatabase(name)) {
    result = tables_->FindFile(name);
    if (result != nullptr) return result;
  }
  return nullptr;
}